

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::
get_interpolated_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  bool bVar1;
  pointer pSVar2;
  value_type *__x;
  pointer pSVar3;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_60;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_40;
  
  if (v == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_default_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&local_60,this);
    local_40.has_value_ = local_60.has_value_;
    if (local_60.has_value_ == true) goto LAB_00391892;
    nonstd::optional_lite::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    ~optional(&local_60);
    nonstd::optional_lite::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    ~optional(&local_40);
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar2 == pSVar3) {
      return false;
    }
  }
  else {
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar3 != pSVar2) {
    bVar1 = tinyusdz::value::TimeSamples::
            get<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar1;
  }
  bVar1 = has_value(this);
  if (bVar1) {
    get_default_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&local_60,this);
    local_40.has_value_ = local_60.has_value_;
    if (local_60.has_value_ == true) {
LAB_00391892:
      local_40.contained.data.__align = local_60.contained.data.__align;
      local_40.contained._8_8_ = local_60.contained._8_8_;
      local_40.contained._16_8_ = local_60.contained._16_8_;
      local_60.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_60.contained._8_8_ = 0;
      local_60.contained._16_8_ = 0;
      nonstd::optional_lite::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      ~optional(&local_60);
      __x = nonstd::optional_lite::
            optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::value(&local_40);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(v,__x);
      nonstd::optional_lite::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      ~optional(&local_40);
      return true;
    }
    nonstd::optional_lite::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    ~optional(&local_60);
    nonstd::optional_lite::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    ~optional(&local_40);
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }